

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O1

void __thiscall dpfb::Font::readFontName(Font *this)

{
  ConstMemStream *this_00;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  pointer pcVar4;
  ushort uVar5;
  ushort uVar6;
  uint32_t uVar7;
  int64_t offset;
  FontError *this_01;
  undefined7 in_register_00000009;
  ushort uVar8;
  char16_t *ch;
  unicode *puVar9;
  ushort uVar10;
  string *this_02;
  ushort uVar11;
  undefined1 uVar12;
  vector<char16_t,_std::allocator<char16_t>_> utf16Name;
  uint16_t value;
  vector<char16_t,_std::allocator<char16_t>_> local_88;
  string *local_70;
  string local_68;
  Font *local_48;
  string *local_40;
  string *local_38;
  
  uVar7 = SfntOffsetTable::getTableOffset(&this->sfntOffsetTable,0x6e616d65);
  if (uVar7 == 0) {
    this_01 = (FontError *)__cxa_allocate_exception(0x10);
    FontError::runtime_error(this_01,"Font has no \"name\" table");
  }
  else {
    this_00 = &this->fontStream;
    streams::ConstMemStream::seek(this_00,(ulong)uVar7,set);
    (*(this->fontStream).super_Stream._vptr_Stream[5])(this_00,&local_68,2);
    if ((ushort)((ushort)local_68._M_dataplus._M_p << 8 | (ushort)local_68._M_dataplus._M_p >> 8) <
        2) {
      (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
      if ((ushort)local_68._M_dataplus._M_p != 0) {
        uVar6 = (ushort)local_68._M_dataplus._M_p << 8 | (ushort)local_68._M_dataplus._M_p >> 8;
        (*(this->fontStream).super_Stream._vptr_Stream[5])(this_00,&local_68,2);
        uVar1 = (ushort)local_68._M_dataplus._M_p << 8;
        uVar2 = (ushort)local_68._M_dataplus._M_p >> 8;
        local_70 = (string *)&(this->fontName).style;
        local_38 = (string *)&this->fontName;
        local_40 = (string *)&(this->fontName).groupFamily;
        local_48 = this;
        do {
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar11 = (ushort)local_68._M_dataplus._M_p << 8 | (ushort)local_68._M_dataplus._M_p >> 8;
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar10 = (ushort)local_68._M_dataplus._M_p;
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar8 = (ushort)local_68._M_dataplus._M_p << 8 | (ushort)local_68._M_dataplus._M_p >> 8;
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar3 = (ushort)local_68._M_dataplus._M_p;
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar5 = (ushort)local_68._M_dataplus._M_p;
          (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
          uVar12 = uVar11 < 3;
          if (0x408 < uVar8 && !(bool)uVar12) {
            if ((((3 < uVar11) || (1 < (ushort)(uVar10 << 8 | uVar10 >> 8))) || (0x409 < uVar8)) ||
               (uVar10 = uVar3 << 8 | uVar3 >> 8, 0x11 < uVar10)) break;
            if (uVar10 < 0x10) {
              this_02 = local_40;
              if ((uVar10 == 1) || (this_02 = local_70, uVar10 == 2)) {
LAB_0010e101:
                uVar10 = (ushort)local_68._M_dataplus._M_p << 8;
                uVar3 = (ushort)local_68._M_dataplus._M_p >> 8;
                offset = streams::ConstMemStream::getPosition(this_00);
                streams::ConstMemStream::seek
                          (this_00,(ulong)((uint)(uVar10 | uVar3) + uVar7 + (uVar1 | uVar2)),set);
                local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<char16_t,_std::allocator<char16_t>_>::resize
                          (&local_88,(ulong)((ushort)(uVar5 << 8 | uVar5 >> 8) >> 1));
                pcVar4 = local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (puVar9 = (unicode *)
                              local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                              _M_impl.super__Vector_impl_data._M_start; puVar9 != (unicode *)pcVar4;
                    puVar9 = puVar9 + 2) {
                  (*(this_00->super_Stream)._vptr_Stream[5])(this_00,&local_68,2);
                  *(ushort *)puVar9 =
                       (ushort)local_68._M_dataplus._M_p << 8 |
                       (ushort)local_68._M_dataplus._M_p >> 8;
                }
                unicode::utf16ToUtf8_abi_cxx11_
                          (&local_68,
                           (unicode *)
                           local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                           (char16_t *)CONCAT71(in_register_00000009,uVar12));
                std::__cxx11::string::operator=(this_02,(string *)&local_68);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT62(local_68._M_dataplus._M_p._2_6_,(ushort)local_68._M_dataplus._M_p)
                    != &local_68.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT62(local_68._M_dataplus._M_p._2_6_,
                                           (ushort)local_68._M_dataplus._M_p));
                }
                streams::ConstMemStream::seek(this_00,offset,set);
                if ((unicode *)
                    local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                    super__Vector_impl_data._M_start != (unicode *)0x0) {
                  operator_delete(local_88.super__Vector_base<char16_t,_std::allocator<char16_t>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
            }
            else {
              this_02 = local_38;
              if ((uVar10 == 0x10) || (this_02 = local_70, uVar10 == 0x11)) goto LAB_0010e101;
            }
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        if ((local_48->fontName).family._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&local_48->fontName);
        }
        return;
      }
      this_01 = (FontError *)__cxa_allocate_exception(0x10);
      FontError::runtime_error(this_01,"\"name\" table has no records");
    }
    else {
      this_01 = (FontError *)__cxa_allocate_exception(0x10);
      FontError::runtime_error(this_01,"Invalid \"name\" table format");
    }
  }
  __cxa_throw(this_01,&FontError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Font::readFontName()
{
    const std::uint16_t platformIdWin = 3;
    const std::uint16_t languageIdWinEnglishUs = 0x0409;
    const std::uint16_t encodingIdWinUcs2 = 1;

    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('n', 'a', 'm', 'e'));
    if (tableOffset == 0)
        // "name" is a required table.
        throw FontError("Font has no \"name\" table");

    fontStream.seek(tableOffset, SeekOrigin::set);

    const auto format = fontStream.readU16Be();
    if (format != 0 && format != 1)
        throw FontError("Invalid \"name\" table format");

    auto count = fontStream.readU16Be();
    if (count == 0)
        throw FontError("\"name\" table has no records");

    const auto stringsOffset = fontStream.readU16Be();
    const auto storageOffset = tableOffset + stringsOffset;

    while (count--) {
        const auto platformId = fontStream.readU16Be();
        const auto encodingId = fontStream.readU16Be();
        const auto languageId = fontStream.readU16Be();
        const auto nameId = fontStream.readU16Be();
        const auto strByteLen = fontStream.readU16Be();
        const auto strOffset = fontStream.readU16Be();

        // We rely on the fact that name records are sorted.
        if (platformId < platformIdWin
                || languageId < languageIdWinEnglishUs)
            continue;
        else if (platformId > platformIdWin
                || encodingId > encodingIdWinUcs2
                || languageId > languageIdWinEnglishUs)
            break;

        if (nameId > 17)
            break;

        std::string* dst;
        switch (nameId) {
            case 1:
                dst = &fontName.groupFamily;
                break;
            case 2:
                dst = &fontName.style;
                break;
            case 16:  // Typographic Family
                dst = &fontName.family;
                break;
            case 17:  // Typographic Subfamily
                dst = &fontName.style;
                break;
            default:
                continue;
                break;
        }

        const auto pos = fontStream.getPosition();
        fontStream.seek(storageOffset + strOffset, SeekOrigin::set);

        std::vector<char16_t> utf16Name;
        utf16Name.resize(strByteLen / 2);
        for (auto& ch : utf16Name)
            ch = fontStream.readU16Be();

        *dst = unicode::utf16ToUtf8(
            utf16Name.data(), utf16Name.data() + utf16Name.size());

        fontStream.seek(pos, SeekOrigin::set);
    }

    // Fallback from id 16 to id 1. No need to do the same for
    // fontName.style (from id 17 to id 2) as it's done naturally
    // by ids order.
    if (fontName.family.empty())
        fontName.family = fontName.groupFamily;
}